

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O2

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm)

{
  uint uVar1;
  uint uVar2;
  U32 *pUVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  char cVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  BYTE *pBVar10;
  long lVar11;
  ulong uVar12;
  int local_60;
  
  pUVar3 = ms->hashTable;
  uVar1 = (ms->cParams).minMatch;
  pUVar4 = ms->chainTable;
  pBVar5 = (ms->window).base;
  uVar9 = (ulong)ms->nextToUpdate;
  cVar6 = (char)(ms->cParams).chainLog;
  uVar2 = (ms->cParams).hashLog;
  pBVar10 = pBVar5 + uVar9;
  do {
    if ((BYTE *)((long)end - 8U) < pBVar10 + 2) {
      return;
    }
    local_60 = (int)pBVar5;
    lVar7 = 0;
    do {
      if (lVar7 == 3) break;
      switch(uVar1) {
      case 5:
        lVar11 = *(long *)(pBVar10 + lVar7);
        uVar8 = lVar11 * -0x30e4432345000000;
        break;
      case 6:
        lVar11 = *(long *)(pBVar10 + lVar7);
        uVar8 = lVar11 * -0x30e4432340650000;
        break;
      case 7:
        lVar11 = *(long *)(pBVar10 + lVar7);
        uVar8 = lVar11 * -0x30e44323405a9d00;
        break;
      case 8:
        lVar11 = *(long *)(pBVar10 + lVar7);
        uVar8 = lVar11 * -0x30e44323485a9b9d;
        break;
      default:
        uVar8 = (ulong)((uint)(*(int *)(pBVar10 + lVar7) * -0x61c8864f) >> (0x20U - cVar6 & 0x1f));
        lVar11 = *(long *)(pBVar10 + lVar7);
        goto LAB_001a9487;
      }
      uVar8 = uVar8 >> (-cVar6 & 0x3fU);
LAB_001a9487:
      uVar12 = (ulong)(lVar11 * -0x30e44323485a9b9d) >> (0x40U - (char)uVar2 & 0x3f);
      if (lVar7 == 0) {
        pUVar4[uVar8] = (int)pBVar10 - local_60;
LAB_001a94a2:
        pUVar3[uVar12] = (int)uVar9 + (int)lVar7;
      }
      else if (pUVar3[uVar12] == 0) goto LAB_001a94a2;
      lVar7 = lVar7 + 1;
    } while (dtlm != ZSTD_dtlm_fast);
    uVar9 = uVar9 + 3;
    pBVar10 = pBVar10 + 3;
  } while( true );
}

Assistant:

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t* ms,
                              void const* end, ZSTD_dictTableLoadMethod_e dtlm)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashLarge = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32  const mls = cParams->minMatch;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const base = ms->window.base;
    const BYTE* ip = base + ms->nextToUpdate;
    const BYTE* const iend = ((const BYTE*)end) - HASH_READ_SIZE;
    const U32 fastHashFillStep = 3;

    /* Always insert every fastHashFillStep position into the hash tables.
     * Insert the other positions into the large hash table if their entry
     * is empty.
     */
    for (; ip + fastHashFillStep - 1 <= iend; ip += fastHashFillStep) {
        U32 const curr = (U32)(ip - base);
        U32 i;
        for (i = 0; i < fastHashFillStep; ++i) {
            size_t const smHash = ZSTD_hashPtr(ip + i, hBitsS, mls);
            size_t const lgHash = ZSTD_hashPtr(ip + i, hBitsL, 8);
            if (i == 0)
                hashSmall[smHash] = curr + i;
            if (i == 0 || hashLarge[lgHash] == 0)
                hashLarge[lgHash] = curr + i;
            /* Only load extra positions for ZSTD_dtlm_full */
            if (dtlm == ZSTD_dtlm_fast)
                break;
    }   }
}